

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int CVmObjBigNum::compute_eq_round(char *ext1,char *ext2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  char *src;
  char *ext1_00;
  bool bVar4;
  uint tmp_hdl;
  char *tmp_ext;
  uint local_2c;
  char *local_28;
  
  uVar1 = *(ushort *)ext1;
  uVar2 = *(ushort *)ext2;
  bVar4 = uVar2 <= uVar1;
  src = ext1;
  ext1_00 = ext2;
  if ((uVar1 <= uVar2) && (src = ext2, ext1_00 = ext1, uVar2 = uVar1, bVar4)) {
    iVar3 = compute_eq_exact(ext1,ext2);
    return iVar3;
  }
  alloc_temp_regs((ulong)uVar2,1,&local_28,&local_2c);
  copy_val(local_28,src,1);
  iVar3 = compute_eq_exact(ext1_00,local_28);
  release_temp_regs(1,(ulong)local_2c);
  return iVar3;
}

Assistant:

int CVmObjBigNum::compute_eq_round(VMG_ const char *ext1, const char *ext2)
{
    size_t prec1 = get_prec(ext1);
    size_t prec2 = get_prec(ext2);
    const char *shorter;
    const char *longer;
    char *tmp_ext;
    uint tmp_hdl;
    int ret;
    
    /* 
     *   allocate a temporary register with a rounded copy of the more
     *   precise of the values 
     */
    if (prec1 > prec2)
    {
        /* the first one is longer */
        longer = ext1;
        shorter = ext2;
    }
    else if (prec1 < prec2)
    {
        /* the second one is longer */
        longer = ext2;
        shorter = ext1;
    }
    else
    {
        /* they're the same - do an exact comparison */
        return compute_eq_exact(ext1, ext2);
    }

    /* get a temp register for rounding the longer value */
    alloc_temp_regs(get_prec(shorter), 1, &tmp_ext, &tmp_hdl);

    /* make a rounded copy */
    copy_val(tmp_ext, longer, TRUE);

    /* compare the rounded copy of the longer value to the shorter value */
    ret = compute_eq_exact(shorter, tmp_ext);

    /* release the temporary register */
    release_temp_regs(1, tmp_hdl);

    /* return the result */
    return ret;
}